

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

void __thiscall fizplex::Base::ftran(Base *this,DVector *vec)

{
  pointer pEVar1;
  double *pdVar2;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *__range1;
  ETM *etm;
  pointer etm_00;
  size_t sVar3;
  DVector w;
  DVector local_40;
  double local_28;
  
  pEVar1 = (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (etm_00 = (this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_start; etm_00 != pEVar1; etm_00 = etm_00 + 1) {
    apply_etm(this,etm_00,vec);
  }
  DVector::DVector(&local_40,this->m);
  if (this->m != 0) {
    sVar3 = 0;
    do {
      pdVar2 = DVector::operator[](vec,sVar3);
      local_28 = *pdVar2;
      pdVar2 = DVector::operator[](&local_40,
                                   (this->row_ordering)._M_t.
                                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                   .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                   [sVar3]);
      *pdVar2 = local_28;
      sVar3 = sVar3 + 1;
    } while (sVar3 < this->m);
  }
  sVar3 = (vec->vals)._M_size;
  if (sVar3 == local_40.vals._M_size) {
    if (sVar3 == 0) goto LAB_001117aa;
    pdVar2 = (vec->vals)._M_data;
  }
  else {
    pdVar2 = (vec->vals)._M_data;
    if (pdVar2 != (double *)0x0) {
      operator_delete(pdVar2);
    }
    (vec->vals)._M_size = local_40.vals._M_size;
    pdVar2 = (double *)operator_new(local_40.vals._M_size << 3);
    (vec->vals)._M_data = pdVar2;
    if (local_40.vals._M_data == (double *)0x0) goto LAB_001117aa;
    sVar3 = (vec->vals)._M_size;
  }
  memcpy(pdVar2,local_40.vals._M_data,sVar3 << 3);
LAB_001117aa:
  vec->dim = local_40.dim;
  operator_delete(local_40.vals._M_data);
  return;
}

Assistant:

void Base::ftran(DVector &vec) const {
  for (auto &etm : etms)
    apply_etm(etm, vec);

  // Reorder vec according to base column swaps
  DVector w(m);
  for (size_t i = 0; i < m; i++)
    w[row_ordering[i]] = vec[i];
  vec = w;
}